

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitsUtils.cpp
# Opt level: O2

void ReadSingleFileWithDigits
               (string *path,
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *samples,vector<float,_std::allocator<float>_> *targets)

{
  char cVar1;
  istream *piVar2;
  float label;
  vector<float,_std::allocator<float>_> params;
  string param;
  string line;
  ifstream file;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::ifstream::ifstream(&file,(string *)path,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&file,(string *)&line,'\n');
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::operator<<(local_1a8,(string *)&line);
      param._M_dataplus._M_p = (pointer)&param.field_2;
      param._M_string_length = 0;
      param.field_2._M_local_buf[0] = '\0';
      params.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      params.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      params.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      while( true ) {
        piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&ss,(string *)&param,',');
        if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
        label = std::__cxx11::stof(&param,(size_t *)0x0);
        std::vector<float,_std::allocator<float>_>::emplace_back<float>
                  ((vector<float,_std::allocator<float>_> *)
                   &params.super__Vector_base<float,_std::allocator<float>_>,&label);
      }
      label = params.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      params.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = params.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back(samples,(value_type *)&params.super__Vector_base<float,_std::allocator<float>_>);
      std::vector<float,_std::allocator<float>_>::push_back(targets,&label);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&params.super__Vector_base<float,_std::allocator<float>_>);
      std::__cxx11::string::~string((string *)&param);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void ReadSingleFileWithDigits( const std::string &path, std::vector<SPIKING_NN::Sample> &samples,
                               std::vector<float> &targets )
{
    std::ifstream file( path );
    if ( file.is_open()) {
        std::string line;
        while ( std::getline( file, line, '\n' )) {
            std::stringstream ss;
            ss << line;
            std::string param;
            std::vector<float> params;
            while ( std::getline( ss, param, ',' )) {
                params.push_back( std::stof( param ));
            }
            float label = params.back();
            params.pop_back();
            samples.push_back( params );
            targets.push_back( label );
        }
    }
}